

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

map2json_tree_t * map2json_createEmptyTreeObject(char *key)

{
  map2json_tree_t *pmVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDI;
  map2json_tree_t *obj;
  
  pmVar1 = (map2json_tree_t *)malloc(0x40);
  pmVar1->next = (s_map2json_tree *)0x0;
  pmVar1->value = (char *)0x0;
  pmVar1->children = (s_map2json_tree *)0x0;
  pmVar1->arrayObjects = (s_map2json_tree *)0x0;
  pmVar1->type = JSMN_OBJECT;
  pmVar1->arrayId = -1;
  pmVar1->maxArrayId = -1;
  if (in_RDI == (char *)0x0) {
    pmVar1->key = (char *)0x0;
  }
  else {
    sVar2 = strlen(in_RDI);
    pcVar3 = (char *)calloc(1,sVar2 + 1);
    pmVar1->key = pcVar3;
    pcVar3 = pmVar1->key;
    sVar2 = strlen(in_RDI);
    memcpy(pcVar3,in_RDI,sVar2);
  }
  return pmVar1;
}

Assistant:

static map2json_tree_t *map2json_createEmptyTreeObject(char *key) {
	DEBUG_TEXT("map2json_createEmptyTreeObject(%s)... ", key);
	map2json_tree_t *obj;

	obj = (map2json_tree_t *) malloc(sizeof(map2json_tree_t));
	obj->next = NULL;
	obj->value = NULL;
	obj->children = NULL;
	obj->arrayObjects = NULL;
	obj->type = JSMN_OBJECT;
	obj->arrayId = -1;
	obj->maxArrayId = -1;

	if ( key == NULL ) {
		obj->key = NULL;
	} else {
		obj->key = (char *) calloc(sizeof(char), strlen(key) + 1);
		memcpy(obj->key, key, strlen(key));
	}

	DEBUG_TEXT("map2json_createEmptyTreeObject(%s)... DONE", key);
	return obj;
}